

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

string * __thiscall
higan::HttpRequest::GetMethodString_abi_cxx11_(string *__return_storage_ptr__,HttpRequest *this)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"ERROR",&local_19);
  if (this->method_ < (HTTP_REQUEST_DELETE|HTTP_REQUEST_GET)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpRequest::GetMethodString() const
{
	std::string result = "ERROR";
	switch (method_)
	{
		case HTTP_REQUEST_UNKNOWN:
			result = "UNKNOWN";
			break;
		case HTTP_REQUEST_GET:
			result = "GET";
			break;
		case HTTP_REQUEST_POST:
			result = "POST";
			break;
		case HTTP_REQUEST_PUT:
			result = "PUT";
			break;
		case HTTP_REQUEST_DELETE:
			result = "DELETE";
			break;
	}

	return result;
}